

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS ref_grid_contiguous_cell_global(REF_GRID ref_grid,REF_LONG *global)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  REF_LONG global_ncell;
  REF_LONG *cell_global;
  
  ref_node = ref_grid->node;
  lVar6 = 0;
  lVar5 = 0;
  iVar4 = 0;
  while( true ) {
    if (lVar6 == 0x10) {
      return 0;
    }
    ref_cell = ref_grid->cell[lVar6];
    uVar1 = ref_cell_global(ref_cell,ref_node,&cell_global);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x4ff,
             "ref_grid_contiguous_cell_global",(ulong)uVar1,"cell global");
      return uVar1;
    }
    uVar2 = (ulong)(uint)ref_cell->max;
    if (ref_cell->max < 1) {
      uVar2 = 0;
    }
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      if (ref_cell->c2n[(long)(int)uVar3 * (long)ref_cell->size_per] != -1) {
        if ((long)ref_cell->n <= (long)uVar3) {
          free(cell_global);
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x503,"ref_grid_contiguous_cell_global",1,"pack grid before calling");
          return 1;
        }
        global[iVar4] = cell_global[uVar3] + lVar5;
        iVar4 = iVar4 + 1;
      }
    }
    free(cell_global);
    uVar1 = ref_cell_ncell(ref_cell,ref_node,&global_ncell);
    if (uVar1 != 0) break;
    lVar5 = lVar5 + global_ncell;
    lVar6 = lVar6 + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x509,
         "ref_grid_contiguous_cell_global",(ulong)uVar1,"global ncell");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_grid_contiguous_cell_global(REF_GRID ref_grid,
                                                   REF_LONG *global) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT group, ncell, cell;
  REF_CELL ref_cell;
  REF_LONG *cell_global, global_ncell, offset;
  ncell = 0;
  offset = 0;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_global(ref_cell, ref_node, &cell_global), "cell global");
    each_ref_cell_valid_cell(ref_cell, cell) {
      if (cell >= ref_cell_n(ref_cell)) {
        ref_free(cell_global);
        RSS(REF_FAILURE, "pack grid before calling");
      }
      global[ncell] = cell_global[cell] + offset;
      ncell++;
    }
    ref_free(cell_global);
    RSS(ref_cell_ncell(ref_cell, ref_node, &global_ncell), "global ncell");
    offset += global_ncell;
  }
  return REF_SUCCESS;
}